

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOServer.cpp
# Opt level: O0

void __thiscall mognetwork::TcpASIOServer::remSocket(TcpASIOServer *this,SocketFD socket)

{
  bool bVar1;
  SocketFD SVar2;
  reference ppTVar3;
  int in_ESI;
  list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *in_RDI;
  TcpSocket *unaff_retaddr;
  TcpSocket *value;
  iterator it;
  TcpSocket *in_stack_ffffffffffffffb8;
  _Self local_20;
  _Self local_18;
  int local_c;
  
  local_c = in_ESI;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>::begin
                 ((list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)
                  in_stack_ffffffffffffffb8);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>::end
                   ((list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)
                    in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar3 = std::_List_iterator<mognetwork::TcpSocket_*>::operator*
                        ((_List_iterator<mognetwork::TcpSocket_*> *)0x11a610);
    SVar2 = Socket::getSocketFD(&(*ppTVar3)->super_Socket);
    if (SVar2 == local_c) {
      ppTVar3 = std::_List_iterator<mognetwork::TcpSocket_*>::operator*
                          ((_List_iterator<mognetwork::TcpSocket_*> *)0x11a628);
      in_stack_ffffffffffffffb8 = *ppTVar3;
      std::_List_iterator<mognetwork::TcpSocket_*>::operator*
                ((_List_iterator<mognetwork::TcpSocket_*> *)0x11a63a);
      TcpSocket::disconnect(unaff_retaddr);
      local_18._M_node =
           (_List_node_base *)
           std::__cxx11::list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>::
           erase(in_RDI,local_18._M_node);
      if (in_stack_ffffffffffffffb8 != (TcpSocket *)0x0) {
        (*(in_stack_ffffffffffffffb8->super_Socket)._vptr_Socket[1])();
      }
    }
    else {
      std::_List_iterator<mognetwork::TcpSocket_*>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void TcpASIOServer::remSocket(SocketFD socket)
  {
    for (std::list<TcpSocket*>::iterator it = m_socketList.begin(); it != m_socketList.end();)
      {
	if ((*it)->getSocketFD() == socket)
	  {
	    TcpSocket* value = *it;
	    (*it)->disconnect();
	    it = m_socketList.erase(it);
	    delete value;
	  }
	else
	  ++it;
      }
  }